

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O3

char * __thiscall Confparse::Parse(Confparse *this,char *key)

{
  char *pcVar1;
  byte *__haystack;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  byte bVar8;
  
  this->value[0] = '\0';
  __haystack = (byte *)this->conf;
  if (((key != (char *)0x0 && __haystack != (byte *)0x0) && (*__haystack != 0)) && (*key != '\0')) {
    sVar4 = strlen(key);
    if (((int)sVar4 != 0) &&
       (pbVar5 = (byte *)strstr((char *)__haystack,key), pbVar5 != (byte *)0x0)) {
      pcVar1 = this->value;
      pbVar2 = (byte *)this->limit;
      do {
        if (pbVar2 <= pbVar5) {
          return (char *)0x0;
        }
        pbVar6 = pbVar5 + (int)sVar4;
        if (pbVar6 < pbVar2) {
          bVar8 = *pbVar6;
          iVar3 = isalnum((int)(char)bVar8);
          if (iVar3 == 0) {
            while ((bVar8 < 0x3e && ((0x2000000100000200U >> ((ulong)bVar8 & 0x3f) & 1) != 0))) {
              pbVar6 = pbVar6 + 1;
              if (pbVar2 <= pbVar6) goto LAB_0010ca56;
              bVar8 = *pbVar6;
            }
            if ((__haystack <= pbVar6) &&
               (((pbVar5 == __haystack || (pbVar5[-1] == 0xd)) || (pbVar5[-1] == 10)))) {
              lVar7 = 0;
              goto LAB_0010ca9c;
            }
          }
        }
LAB_0010ca56:
        pbVar5 = (byte *)strstr((char *)(pbVar5 + 1),key);
      } while (pbVar5 != (byte *)0x0);
    }
  }
  return (char *)0x0;
  while( true ) {
    bVar8 = pbVar6[lVar7];
    if ((bVar8 < 0xe) && ((0x2401U >> (bVar8 & 0x1f) & 1) != 0)) goto LAB_0010caca;
    pcVar1[lVar7] = bVar8;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x2800) break;
LAB_0010ca9c:
    if (this->limit <= pbVar6 + lVar7) goto LAB_0010caca;
  }
  lVar7 = 0x2800;
LAB_0010caca:
  pcVar1[lVar7] = '\0';
  return pcVar1;
}

Assistant:

char *Confparse::Parse(const char *key) {
	char *p, *op;
	char *llimit;
	int keylen;

	value[0] = '\0';

	if (!conf) return NULL;
	if (!key) return NULL;

	if (!conf[0]) return NULL;
	if (!key[0]) return NULL;

	keylen = strlen(key);
	if (keylen == 0) return NULL;

	p = strstr(conf, key);
	if (p == NULL) {
		return NULL;
	}

	op = p;

	llimit = limit; // - keylen - 2; // allows for up to 'key=x'

	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;

		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) p++; // get up to the start of the value;

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					size_t i = 0;

					/*
					 * Search for the end of the data by finding the end of the line
					 */
					while ((p < limit) && ((*p != '\0') && (*p != '\n') && (*p != '\r'))) {
						value[i] = *p;
						p++;
						i++;
						if (i >= CONFPARSE_MAX_VALUE_SIZE) break;
					}
					value[i] = '\0';
					return value;
				}
			}
		}

		// if the previous strstr() was a non-success, then try search again from the next bit
		if (op < limit) {
			p = strstr(op + 1, key);
			if (!p) break;
			op = p;
		} else {
			break;
		}
	}
	return NULL;
}